

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mod.hpp
# Opt level: O0

uint boost::random::const_mod<unsigned_int,_2147483647U>::add(uint x,uint c)

{
  unsigned_type uVar1;
  unsigned_type uVar2;
  int in_ESI;
  uint in_EDI;
  undefined4 local_4;
  
  uVar1 = unsigned_m();
  uVar2 = unsigned_m();
  if ((uVar1 - 1 & uVar2) == 0) {
    uVar1 = unsigned_m();
    local_4 = in_EDI + in_ESI & uVar1 - 1;
  }
  else {
    local_4 = in_EDI;
    if (in_ESI != 0) {
      if (in_EDI < 0x7fffffffU - in_ESI) {
        local_4 = in_EDI + in_ESI;
      }
      else {
        local_4 = in_EDI - (0x7fffffff - in_ESI);
      }
    }
  }
  return local_4;
}

Assistant:

static IntType add(IntType x, IntType c)
  {
    if(((unsigned_m() - 1) & unsigned_m()) == 0)
      return (unsigned_type(x) + unsigned_type(c)) & (unsigned_m() - 1);
    else if(c == 0)
      return x;
    else if(x < m - c)
      return x + c;
    else
      return x - (m - c);
  }